

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_timer.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  ptime pVar4;
  ptime pVar5;
  ptime pVar6;
  ptime pVar7;
  ptime pVar8;
  time1 func;
  undefined1 auVar9 [12];
  undefined1 local_238 [12];
  undefined1 local_228 [12];
  deadline_timer t2;
  io_service srv;
  deadline_timer timer;
  ptime local_1b8 [2];
  ostringstream oss;
  
  booster::aio::deadline_timer::deadline_timer(&timer);
  local_228 = booster::ptime::now();
  local_238._0_8_ = 0;
  local_238._8_4_ = 0;
  booster::ptime::normalize((ptime *)local_238);
  pVar4 = booster::ptime::seconds(1);
  _oss = pVar4.sec;
  pVar4 = booster::ptime::operator+((ptime *)local_228,(ptime *)&oss);
  pVar4._8_8_ = pVar4.sec;
  pVar4.sec = (longlong)&timer;
  booster::aio::deadline_timer::expires_at(pVar4);
  auVar9 = booster::aio::deadline_timer::expires_at();
  pVar4 = booster::ptime::seconds(1);
  _oss = pVar4.sec;
  pVar4 = booster::ptime::operator+((ptime *)local_228,(ptime *)&oss);
  if ((auVar9._0_8_ != pVar4.sec) || (auVar9._8_4_ != pVar4.nsec)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x32);
    std::operator<<(poVar2," timer.expires_at() == now + ptime::seconds(1)");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)&t2);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_238 = booster::aio::deadline_timer::expires_from_now();
  pVar4 = booster::ptime::milliseconds(1000);
  _oss = pVar4.sec;
  bVar1 = booster::ptime::operator<=((ptime *)local_238,(ptime *)&oss);
  if (bVar1) {
    pVar4 = booster::ptime::milliseconds(900);
    _t2 = pVar4.sec;
    bVar1 = booster::ptime::operator>=((ptime *)local_238,(ptime *)&t2);
    if (bVar1) {
      pVar4 = booster::ptime::milliseconds(2000);
      pVar5._8_8_ = pVar4.sec;
      pVar5.sec = (longlong)&timer;
      booster::aio::deadline_timer::expires_from_now(pVar5);
      auVar9 = booster::aio::deadline_timer::expires_at();
      local_238 = auVar9;
      pVar4 = booster::ptime::seconds(2);
      _t2 = pVar4.sec;
      pVar4 = booster::ptime::operator+((ptime *)local_228,(ptime *)&t2);
      _oss = pVar4.sec;
      bVar1 = booster::ptime::operator>=((ptime *)local_238,(ptime *)&oss);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar2 = std::operator<<((ostream *)&oss,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x35);
        std::operator<<(poVar2," (tmp = timer.expires_at()) >= now + ptime::seconds(2)");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar3,(string *)&t2);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pVar4 = booster::ptime::milliseconds(0x834);
      _t2 = pVar4.sec;
      pVar4 = booster::ptime::operator+((ptime *)local_228,(ptime *)&t2);
      _oss = pVar4.sec;
      bVar1 = booster::ptime::operator<=((ptime *)local_238,(ptime *)&oss);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar2 = std::operator<<((ostream *)&oss,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x36);
        std::operator<<(poVar2," tmp <= now + ptime::milliseconds(2100)");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar3,(string *)&t2);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      auVar9 = booster::aio::deadline_timer::expires_from_now();
      local_238 = auVar9;
      pVar4 = booster::ptime::seconds(2);
      _oss = pVar4.sec;
      bVar1 = booster::ptime::operator<=((ptime *)local_238,(ptime *)&oss);
      if (bVar1) {
        pVar4 = booster::ptime::milliseconds(0x76c);
        _t2 = pVar4.sec;
        bVar1 = booster::ptime::operator>=((ptime *)local_238,(ptime *)&t2);
        if (bVar1) {
          auVar9 = booster::ptime::now();
          local_228 = auVar9;
          pVar4 = booster::ptime::milliseconds(100);
          pVar6._8_8_ = pVar4.sec;
          pVar6.sec = (longlong)&timer;
          booster::aio::deadline_timer::expires_from_now(pVar6);
          booster::aio::deadline_timer::wait();
          _oss = booster::ptime::now();
          pVar4 = booster::ptime::operator-((ptime *)&oss,(ptime *)local_228);
          local_238._0_8_ = pVar4.sec;
          local_238._8_4_ = pVar4.nsec;
          pVar4 = booster::ptime::milliseconds(100);
          _t2 = pVar4.sec;
          bVar1 = booster::ptime::operator>=((ptime *)local_238,(ptime *)&t2);
          if (!bVar1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
            poVar2 = std::operator<<((ostream *)&oss,"Error ");
            poVar2 = std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                                    );
            poVar2 = std::operator<<(poVar2,":");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3c);
            std::operator<<(poVar2,
                            " (tmp = (booster::ptime::now() - now)) >= ptime::milliseconds(100)");
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar3,(string *)&t2);
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pVar4 = booster::ptime::milliseconds(300);
          if ((pVar4.sec <= (long)local_238._0_8_) &&
             ((pVar4.sec < (long)local_238._0_8_ || (pVar4.nsec <= (int)local_238._8_4_)))) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
            poVar2 = std::operator<<((ostream *)&oss,"Error ");
            poVar2 = std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                                    );
            poVar2 = std::operator<<(poVar2,":");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3d);
            std::operator<<(poVar2," tmp < ptime::milliseconds(300)");
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar3,(string *)&t2);
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          booster::aio::io_service::io_service(&srv);
          booster::aio::deadline_timer::set_io_service((io_service *)&timer);
          booster::aio::deadline_timer::deadline_timer(&t2,&srv);
          auVar9 = booster::ptime::now();
          local_228 = auVar9;
          pVar4 = booster::ptime::seconds(2);
          pVar7._8_8_ = pVar4.sec;
          pVar7.sec = (longlong)&t2;
          booster::aio::deadline_timer::expires_from_now(pVar7);
          pVar4 = booster::ptime::milliseconds(100);
          pVar8._8_8_ = pVar4.sec;
          pVar8.sec = (longlong)&timer;
          booster::aio::deadline_timer::expires_from_now(pVar8);
          func.timer2 = &t2;
          func.srv = &srv;
          booster::callback<void_(const_std::error_code_&)>::callback<time1>
                    ((callback<void_(const_std::error_code_&)> *)&oss,func);
          booster::aio::deadline_timer::async_wait((callback *)&timer);
          booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                    ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&oss);
          booster::callback<void_(const_std::error_code_&)>::callback<time2>
                    ((callback<void_(const_std::error_code_&)> *)&oss,&srv);
          booster::aio::deadline_timer::async_wait((callback *)&t2);
          booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                    ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&oss);
          booster::aio::io_service::run();
          bVar1 = booster::ptime::operator>=(&occured2_at,&occured1_at);
          if (!bVar1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
            poVar2 = std::operator<<((ostream *)&oss,"Error ");
            poVar2 = std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                                    );
            poVar2 = std::operator<<(poVar2,":");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x4d);
            std::operator<<(poVar2," occured2_at >= occured1_at");
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar3,(string *)local_1b8);
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pVar4 = booster::ptime::milliseconds(100);
          local_1b8[0].sec = pVar4.sec;
          local_1b8[0].nsec = pVar4.nsec;
          pVar4 = booster::ptime::operator+((ptime *)local_228,local_1b8);
          _oss = pVar4.sec;
          bVar1 = booster::ptime::operator>=(&occured1_at,(ptime *)&oss);
          if (bVar1) {
            pVar4 = booster::ptime::milliseconds(300);
            _oss = pVar4.sec;
            pVar4 = booster::ptime::operator+((ptime *)local_228,(ptime *)&oss);
            if ((pVar4.sec <= occured2_at.sec) &&
               ((pVar4.sec < occured2_at.sec || (pVar4.nsec <= occured2_at.nsec)))) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
              poVar2 = std::operator<<((ostream *)&oss,"Error ");
              poVar2 = std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                                      );
              poVar2 = std::operator<<(poVar2,":");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x4f);
              std::operator<<(poVar2," occured2_at < now + ptime::milliseconds(300)");
              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(prVar3,(string *)local_1b8);
              __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            booster::aio::deadline_timer::~deadline_timer(&t2);
            booster::aio::io_service::~io_service(&srv);
            booster::aio::deadline_timer::~deadline_timer(&timer);
            poVar2 = std::operator<<((ostream *)&std::cout,"Ok");
            std::endl<char,std::char_traits<char>>(poVar2);
            return 0;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
          poVar2 = std::operator<<((ostream *)&oss,"Error ");
          poVar2 = std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                                  );
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x4e);
          std::operator<<(poVar2," occured1_at >= now + ptime::milliseconds(100)");
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar3,(string *)local_1b8);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x37);
      std::operator<<(poVar2,
                      " (tmp = timer.expires_from_now()) <= ptime::seconds(2) && tmp >= ptime::milliseconds(1900)"
                     );
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)&t2);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x33);
  std::operator<<(poVar2,
                  " (tmp = timer.expires_from_now()) <= ptime::milliseconds(1000) && tmp >=ptime::milliseconds(900)"
                 );
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar3,(string *)&t2);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		using booster::ptime;
		booster::aio::deadline_timer timer;
		booster::ptime now=booster::ptime::now(),tmp;
		timer.expires_at(now + ptime::seconds(1));
		TEST(timer.expires_at() == now + ptime::seconds(1));
		TEST((tmp = timer.expires_from_now()) <= ptime::milliseconds(1000) && tmp >=ptime::milliseconds(900));
		timer.expires_from_now(ptime::milliseconds(2000));
		TEST((tmp = timer.expires_at()) >= now + ptime::seconds(2));
		TEST(tmp <= now + ptime::milliseconds(2100));
		TEST((tmp = timer.expires_from_now()) <= ptime::seconds(2) && tmp >= ptime::milliseconds(1900));
		
		now = booster::ptime::now();
		timer.expires_from_now(ptime::milliseconds(100));
		timer.wait();
		TEST( (tmp = (booster::ptime::now() - now)) >= ptime::milliseconds(100));
		TEST( tmp < ptime::milliseconds(300));

		booster::aio::io_service srv;
		timer.set_io_service(srv);
		booster::aio::deadline_timer t2(srv);
		
		now = booster::ptime::now();


		t2.expires_from_now(ptime::seconds(2));
		timer.expires_from_now(ptime::milliseconds(100));
		time1 exec1 = { &srv, &t2 };
		time2 exec2 = { &srv };
		timer.async_wait(exec1);
		t2.async_wait(exec2);
		srv.run();
		TEST(occured2_at >= occured1_at);
		TEST(occured1_at >= now + ptime::milliseconds(100));
		TEST(occured2_at < now + ptime::milliseconds(300));
	}
	catch(std::exception const &e)
	{
		std::cerr << "Fail: " <<e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}